

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ssize_t __thiscall
kj::ArrayOutputStream::write(ArrayOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte **params_1;
  uchar *puVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  byte *__src;
  byte *__dest;
  Fault f;
  size_t size_local;
  void *local_18;
  
  __src = (byte *)CONCAT44(in_register_00000034,__fd);
  params_1 = &this->fillPos;
  __dest = this->fillPos;
  puVar1 = (this->array).ptr;
  pvVar2 = (void *)(this->array).size_;
  size_local = (size_t)__buf;
  if ((__dest == __src) &&
     (local_18 = (void *)((long)pvVar2 + ((long)puVar1 - (long)__src)), local_18 != (void *)0x0)) {
    if (local_18 < __buf) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long&,unsigned_char*&,long>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x114,FAILED,"size <= array.end() - fillPos",
                 "size, fillPos, array.end() - fillPos",&size_local,params_1,(long *)&local_18);
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else {
    if ((void *)((long)pvVar2 + ((long)puVar1 - (long)__dest)) < __buf) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[77]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x118,FAILED,"size <= (size_t)(array.end() - fillPos)",
                 "\"ArrayOutputStream\'s backing array was not large enough for the data written.\""
                 ,(char (*) [77])
                  "ArrayOutputStream\'s backing array was not large enough for the data written.");
      kj::_::Debug::Fault::fatal(&f);
    }
    pvVar2 = memcpy(__dest,__src,(size_t)__buf);
    __dest = *params_1;
  }
  *params_1 = __dest + (long)__buf;
  return (ssize_t)pvVar2;
}

Assistant:

void ArrayOutputStream::write(const void* src, size_t size) {
  if (src == fillPos && fillPos != array.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= array.end() - fillPos, size, fillPos, array.end() - fillPos);
    fillPos += size;
  } else {
    KJ_REQUIRE(size <= (size_t)(array.end() - fillPos),
            "ArrayOutputStream's backing array was not large enough for the data written.");
    memcpy(fillPos, src, size);
    fillPos += size;
  }
}